

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

byte * __thiscall
Js::InterpreterStackFrame::OP_ProfiledLoopEnd<(Js::LayoutSize)1,true>
          (InterpreterStackFrame *this,byte *ip)

{
  ushort uVar1;
  long lVar2;
  code *pcVar3;
  bool bVar4;
  InterpreterStackFrame IVar5;
  OpLayoutT_Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *pOVar6;
  FunctionBody *this_00;
  DynamicProfileInfo *pDVar7;
  undefined4 *puVar8;
  uint loopNumber;
  byte *local_28;
  byte *ip_local;
  
  local_28 = ip;
  pOVar6 = ByteCodeReader::
           GetLayout<Js::OpLayoutT_Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
                     ((ByteCodeReader *)this,&local_28);
  uVar1 = pOVar6->C1;
  loopNumber = (uint)uVar1;
  CheckIfLoopIsHot(this,*(uint *)(this + 0xd0));
  this_00 = JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(this + 0x80));
  if ((this_00->dynamicProfileInfo).ptr != (DynamicProfileInfo *)0x0) {
    pDVar7 = FunctionBody::GetAnyDynamicProfileInfo(this_00);
    DynamicProfileInfo::SetLoopInterpreted(pDVar7,loopNumber);
    if (*(uint *)(this + 0xd0) < DAT_01441e00) {
      if (*(uint *)(this + 0xd0) == 0) {
        bVar4 = FunctionBody::DoJITLoopBody(*(FunctionBody **)(this + 0x88));
        if (!bVar4) goto LAB_00959ead;
      }
    }
    else {
LAB_00959ead:
      pDVar7 = FunctionBody::GetAnyDynamicProfileInfo(this_00);
      DynamicProfileInfo::SetMemOpMinReached(pDVar7,(uint)uVar1);
    }
  }
  *(undefined4 *)(this + 0xd0) = 0;
  bVar4 = DynamicProfileInfo::EnableImplicitCallFlags(*(FunctionBody **)(this + 0x88));
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x16ed,
                                "(Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionBody()))"
                                ,
                                "Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionBody())"
                               );
    if (!bVar4) goto LAB_00959fe9;
    *puVar8 = 0;
  }
  OP_RecordImplicitCall(this,loopNumber);
  if (*(uint *)(this + 0xd8) == loopNumber) {
    IVar5 = this[0xd6];
    if (((byte)IVar5 & 8) != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x16f3,"(!switchProfileMode)","!switchProfileMode");
      if (!bVar4) {
LAB_00959fe9:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar8 = 0;
      IVar5 = this[0xd6];
    }
    this[0xd6] = (InterpreterStackFrame)((byte)IVar5 | 8);
    *(undefined4 *)(this + 0xd8) = 0xffffffff;
  }
  lVar2 = *(long *)(*(long *)(this + 0x78) + 0x3b8);
  *(byte *)(lVar2 + 0x1570) =
       *(byte *)(lVar2 + 0x1570) | *(byte *)(*(long *)(this + 0xc0) + (ulong)loopNumber);
  if (*(char *)(lVar2 + 0x1658) != '\0') {
    *(char *)(lVar2 + 0x1658) = *(char *)(lVar2 + 0x1658) + -1;
  }
  return local_28;
}

Assistant:

const byte * InterpreterStackFrame::OP_ProfiledLoopEnd(const byte * ip)
    {
        uint32 loopNumber = m_reader.GetLayout<OpLayoutT_Unsigned1<LayoutSizePolicy<layoutSize>>>(ip)->C1;
        if (!profiled && !isAutoProfiling)
        {
            return ip;
        }

        this->CheckIfLoopIsHot(this->currentLoopCounter);
        Js::FunctionBody *fn = this->function->GetFunctionBody();
        if (fn->HasDynamicProfileInfo())
        {
            fn->GetAnyDynamicProfileInfo()->SetLoopInterpreted(loopNumber);
            // If the counter is 0, there is a high chance that some config disabled tracking that information. (ie: -off:jitloopbody)
            // Assume it is valid for memop in this case.
            if (this->currentLoopCounter >= (uint)CONFIG_FLAG(MinMemOpCount) ||
                (this->currentLoopCounter == 0 && !this->m_functionBody->DoJITLoopBody())
                )
            {
                // This flag becomes relevant only if the loop has been interpreted
                fn->GetAnyDynamicProfileInfo()->SetMemOpMinReached(loopNumber);
            }
        }

        this->currentLoopCounter = 0;

        if (profiled)
        {
            Assert(Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionBody()));
            OP_RecordImplicitCall(loopNumber);

            if (switchProfileModeOnLoopEndNumber == loopNumber)
            {
                // Stop profiling since the jitted loop body would be exiting the loop
                Assert(!switchProfileMode);
                switchProfileMode = true;
                switchProfileModeOnLoopEndNumber = 0u - 1;
            }
        }

        // Restore the implicit call flags state and add with flags in the loop as well
        ThreadContext *const threadContext = GetScriptContext()->GetThreadContext();
        threadContext->AddImplicitCallFlags(this->savedLoopImplicitCallFlags[loopNumber]);

        threadContext->DecrementLoopDepth();
        return ip;
    }